

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lysp_type_dup(ly_ctx *ctx,lysp_module *pmod,lysp_type *orig_type,lysp_type *type)

{
  lysp_type *plVar1;
  LY_ERR LVar2;
  lysp_restr *plVar3;
  lysp_ext_instance *local_260;
  lysp_ext_instance *local_250;
  lysp_ext_instance *local_240;
  lysp_ext_instance *local_238;
  lysp_ext_instance *local_220;
  char *local_218;
  long local_208;
  long local_1f8;
  long local_1f0;
  char *local_1d8;
  char *local_1c8;
  char *local_1b8;
  char *local_1b0;
  char *local_198;
  long local_188;
  long local_178;
  long local_170;
  char *local_158;
  long local_148;
  long local_138;
  long local_130;
  lysp_ext_instance *local_118;
  lysp_ext_instance *local_108;
  lysp_ext_instance *local_f8;
  lysp_ext_instance *local_f0;
  long *plStack_d0;
  LY_ERR ret___7;
  char *p___5;
  uint64_t __new_start;
  uint64_t __u_5;
  long *plStack_b0;
  LY_ERR ret___6;
  char *p___4;
  uint64_t __u_4;
  long *plStack_98;
  LY_ERR ret___5;
  char *p___3;
  uint64_t __u_3;
  long *plStack_80;
  LY_ERR ret___4;
  char *p___2;
  uint64_t __u_2;
  long *plStack_68;
  LY_ERR ret___3;
  char *p___1;
  uint64_t __u_1;
  long *plStack_50;
  LY_ERR ret___2;
  char *p__;
  uint64_t __u;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_ERR ret;
  lysp_type *type_local;
  lysp_type *orig_type_local;
  lysp_module *pmod_local;
  ly_ctx *ctx_local;
  
  memset(type,0,0x68);
  ret___1 = lydict_dup(ctx,orig_type->name,&type->name);
  if (ret___1 == LY_SUCCESS) {
    if (orig_type->range != (lysp_restr *)0x0) {
      plVar3 = (lysp_restr *)calloc(1,0x40);
      type->range = plVar3;
      if (type->range == (lysp_restr *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
        return LY_EMEM;
      }
      LVar2 = lysp_restr_dup(ctx,pmod,orig_type->range,type->range);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    if (orig_type->length != (lysp_restr *)0x0) {
      plVar3 = (lysp_restr *)calloc(1,0x40);
      type->length = plVar3;
      if (type->length == (lysp_restr *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
        return LY_EMEM;
      }
      LVar2 = lysp_restr_dup(ctx,pmod,orig_type->length,type->length);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    if (orig_type->patterns != (lysp_restr *)0x0) {
      if (type->patterns == (lysp_restr *)0x0) {
        if (orig_type->patterns == (lysp_restr *)0x0) {
          local_f8 = (lysp_ext_instance *)0x0;
        }
        else {
          local_f8 = orig_type->patterns[-1].exts;
        }
        plStack_50 = (long *)calloc(1,(long)local_f8 * 0x40 + 8);
        if (plStack_50 == (long *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
          return LY_EMEM;
        }
      }
      else {
        if (orig_type->patterns == (lysp_restr *)0x0) {
          local_f0 = (lysp_ext_instance *)0x0;
        }
        else {
          local_f0 = orig_type->patterns[-1].exts;
        }
        plStack_50 = (long *)realloc(&type->patterns[-1].exts,
                                     ((long)&local_f0->name + (long)&(type->patterns[-1].exts)->name
                                     ) * 0x40 + 8);
        if (plStack_50 == (long *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
          return LY_EMEM;
        }
      }
      type->patterns = (lysp_restr *)(plStack_50 + 1);
      if (type->patterns != (lysp_restr *)0x0) {
        if (orig_type->patterns == (lysp_restr *)0x0) {
          local_108 = (lysp_ext_instance *)0x0;
        }
        else {
          local_108 = orig_type->patterns[-1].exts;
        }
        memset(type->patterns + *plStack_50,0,(long)local_108 << 6);
      }
      p__ = (char *)0x0;
      while( true ) {
        if (orig_type->patterns == (lysp_restr *)0x0) {
          local_118 = (lysp_ext_instance *)0x0;
        }
        else {
          local_118 = orig_type->patterns[-1].exts;
        }
        if (local_118 <= p__) break;
        type->patterns[-1].exts = (lysp_ext_instance *)((long)&(type->patterns[-1].exts)->name + 1);
        LVar2 = lysp_restr_dup(ctx,pmod,orig_type->patterns + (long)p__,type->patterns + (long)p__);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        p__ = p__ + 1;
      }
    }
    if (orig_type->enums != (lysp_type_enum *)0x0) {
      if (type->enums == (lysp_type_enum *)0x0) {
        if (orig_type->enums == (lysp_type_enum *)0x0) {
          local_138 = 0;
        }
        else {
          local_138 = *(long *)&orig_type->enums[-1].flags;
        }
        plStack_68 = (long *)calloc(1,local_138 * 0x38 + 8);
        if (plStack_68 == (long *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
          return LY_EMEM;
        }
      }
      else {
        if (orig_type->enums == (lysp_type_enum *)0x0) {
          local_130 = 0;
        }
        else {
          local_130 = *(long *)&orig_type->enums[-1].flags;
        }
        plStack_68 = (long *)realloc(&type->enums[-1].flags,
                                     (*(long *)&type->enums[-1].flags + local_130) * 0x38 + 8);
        if (plStack_68 == (long *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
          return LY_EMEM;
        }
      }
      type->enums = (lysp_type_enum *)(plStack_68 + 1);
      if (type->enums != (lysp_type_enum *)0x0) {
        if (orig_type->enums == (lysp_type_enum *)0x0) {
          local_148 = 0;
        }
        else {
          local_148 = *(long *)&orig_type->enums[-1].flags;
        }
        memset(type->enums + *plStack_68,0,local_148 * 0x38);
      }
      p___1 = (char *)0x0;
      while( true ) {
        if (orig_type->enums == (lysp_type_enum *)0x0) {
          local_158 = (char *)0x0;
        }
        else {
          local_158 = *(char **)&orig_type->enums[-1].flags;
        }
        if (local_158 <= p___1) break;
        *(long *)&type->enums[-1].flags = *(long *)&type->enums[-1].flags + 1;
        LVar2 = lysp_type_enum_dup(ctx,pmod,orig_type->enums + (long)p___1,type->enums + (long)p___1
                                  );
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        p___1 = p___1 + 1;
      }
    }
    if (orig_type->bits != (lysp_type_enum *)0x0) {
      if (type->bits == (lysp_type_enum *)0x0) {
        if (orig_type->bits == (lysp_type_enum *)0x0) {
          local_178 = 0;
        }
        else {
          local_178 = *(long *)&orig_type->bits[-1].flags;
        }
        plStack_80 = (long *)calloc(1,local_178 * 0x38 + 8);
        if (plStack_80 == (long *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
          return LY_EMEM;
        }
      }
      else {
        if (orig_type->bits == (lysp_type_enum *)0x0) {
          local_170 = 0;
        }
        else {
          local_170 = *(long *)&orig_type->bits[-1].flags;
        }
        plStack_80 = (long *)realloc(&type->bits[-1].flags,
                                     (*(long *)&type->bits[-1].flags + local_170) * 0x38 + 8);
        if (plStack_80 == (long *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
          return LY_EMEM;
        }
      }
      type->bits = (lysp_type_enum *)(plStack_80 + 1);
      if (type->bits != (lysp_type_enum *)0x0) {
        if (orig_type->bits == (lysp_type_enum *)0x0) {
          local_188 = 0;
        }
        else {
          local_188 = *(long *)&orig_type->bits[-1].flags;
        }
        memset(type->bits + *plStack_80,0,local_188 * 0x38);
      }
      p___2 = (char *)0x0;
      while( true ) {
        if (orig_type->bits == (lysp_type_enum *)0x0) {
          local_198 = (char *)0x0;
        }
        else {
          local_198 = *(char **)&orig_type->bits[-1].flags;
        }
        if (local_198 <= p___2) break;
        *(long *)&type->bits[-1].flags = *(long *)&type->bits[-1].flags + 1;
        LVar2 = lysp_type_enum_dup(ctx,pmod,orig_type->bits + (long)p___2,type->bits + (long)p___2);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        p___2 = p___2 + 1;
      }
    }
    ret___1 = lyxp_expr_dup(ctx,orig_type->path,0,0,&type->path);
    if (ret___1 == LY_SUCCESS) {
      if (orig_type->bases != (char **)0x0) {
        if (type->bases == (char **)0x0) {
          if (orig_type->bases == (char **)0x0) {
            local_1b8 = (char *)0x0;
          }
          else {
            local_1b8 = orig_type->bases[-1];
          }
          plStack_98 = (long *)calloc(1,(long)local_1b8 * 8 + 8);
          if (plStack_98 == (long *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
            return LY_EMEM;
          }
        }
        else {
          if (orig_type->bases == (char **)0x0) {
            local_1b0 = (char *)0x0;
          }
          else {
            local_1b0 = orig_type->bases[-1];
          }
          plStack_98 = (long *)realloc(type->bases + -1,
                                       (long)(type->bases[-1] + (long)local_1b0) * 8 + 8);
          if (plStack_98 == (long *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
            return LY_EMEM;
          }
        }
        type->bases = (char **)(plStack_98 + 1);
        if (type->bases != (char **)0x0) {
          if (orig_type->bases == (char **)0x0) {
            local_1c8 = (char *)0x0;
          }
          else {
            local_1c8 = orig_type->bases[-1];
          }
          memset(type->bases + *plStack_98,0,(long)local_1c8 << 3);
        }
        p___3 = (char *)0x0;
        while( true ) {
          if (orig_type->bases == (char **)0x0) {
            local_1d8 = (char *)0x0;
          }
          else {
            local_1d8 = orig_type->bases[-1];
          }
          if (local_1d8 <= p___3) break;
          type->bases[-1] = type->bases[-1] + 1;
          LVar2 = lysp_string_dup(ctx,orig_type->bases + (long)p___3,type->bases + (long)p___3);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          p___3 = p___3 + 1;
        }
      }
      if (orig_type->types != (lysp_type *)0x0) {
        if (type->types == (lysp_type *)0x0) {
          if (orig_type->types == (lysp_type *)0x0) {
            local_1f8 = 0;
          }
          else {
            plVar1 = orig_type->types;
            local_1f8._0_1_ = plVar1[-1].fraction_digits;
            local_1f8._1_1_ = plVar1[-1].require_instance;
            local_1f8._2_2_ = plVar1[-1].flags;
            local_1f8._4_4_ = *(undefined4 *)&plVar1[-1].field_0x64;
          }
          plStack_b0 = (long *)calloc(1,local_1f8 * 0x68 + 8);
          if (plStack_b0 == (long *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
            return LY_EMEM;
          }
        }
        else {
          if (orig_type->types == (lysp_type *)0x0) {
            local_1f0 = 0;
          }
          else {
            plVar1 = orig_type->types;
            local_1f0._0_1_ = plVar1[-1].fraction_digits;
            local_1f0._1_1_ = plVar1[-1].require_instance;
            local_1f0._2_2_ = plVar1[-1].flags;
            local_1f0._4_4_ = *(undefined4 *)&plVar1[-1].field_0x64;
          }
          plStack_b0 = (long *)realloc(&type->types[-1].fraction_digits,
                                       (*(long *)&type->types[-1].fraction_digits + local_1f0) *
                                       0x68 + 8);
          if (plStack_b0 == (long *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
            return LY_EMEM;
          }
        }
        type->types = (lysp_type *)(plStack_b0 + 1);
        if (type->types != (lysp_type *)0x0) {
          if (orig_type->types == (lysp_type *)0x0) {
            local_208 = 0;
          }
          else {
            plVar1 = orig_type->types;
            local_208._0_1_ = plVar1[-1].fraction_digits;
            local_208._1_1_ = plVar1[-1].require_instance;
            local_208._2_2_ = plVar1[-1].flags;
            local_208._4_4_ = *(undefined4 *)&plVar1[-1].field_0x64;
          }
          memset(type->types + *plStack_b0,0,local_208 * 0x68);
        }
        p___4 = (char *)0x0;
        while( true ) {
          if (orig_type->types == (lysp_type *)0x0) {
            local_218 = (char *)0x0;
          }
          else {
            local_218 = *(char **)&orig_type->types[-1].fraction_digits;
          }
          if (local_218 <= p___4) break;
          *(long *)&type->types[-1].fraction_digits = *(long *)&type->types[-1].fraction_digits + 1;
          LVar2 = lysp_type_dup(ctx,pmod,orig_type->types + (long)p___4,type->types + (long)p___4);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          p___4 = p___4 + 1;
        }
      }
      if (orig_type->exts != (lysp_ext_instance *)0x0) {
        if (type->exts == (lysp_ext_instance *)0x0) {
          local_220 = (lysp_ext_instance *)0x0;
        }
        else {
          local_220 = type->exts[-1].exts;
        }
        if (type->exts == (lysp_ext_instance *)0x0) {
          if (orig_type->exts == (lysp_ext_instance *)0x0) {
            local_240 = (lysp_ext_instance *)0x0;
          }
          else {
            local_240 = orig_type->exts[-1].exts;
          }
          plStack_d0 = (long *)calloc(1,(long)local_240 * 0x70 + 8);
          if (plStack_d0 == (long *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
            return LY_EMEM;
          }
        }
        else {
          if (orig_type->exts == (lysp_ext_instance *)0x0) {
            local_238 = (lysp_ext_instance *)0x0;
          }
          else {
            local_238 = orig_type->exts[-1].exts;
          }
          plStack_d0 = (long *)realloc(&type->exts[-1].exts,
                                       ((long)&local_238->name + (long)&(type->exts[-1].exts)->name)
                                       * 0x70 + 8);
          if (plStack_d0 == (long *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_dup");
            return LY_EMEM;
          }
        }
        type->exts = (lysp_ext_instance *)(plStack_d0 + 1);
        if (type->exts != (lysp_ext_instance *)0x0) {
          if (orig_type->exts == (lysp_ext_instance *)0x0) {
            local_250 = (lysp_ext_instance *)0x0;
          }
          else {
            local_250 = orig_type->exts[-1].exts;
          }
          memset(type->exts + *plStack_d0,0,(long)local_250 * 0x70);
        }
        __new_start = 0;
        while( true ) {
          if (orig_type->exts == (lysp_ext_instance *)0x0) {
            local_260 = (lysp_ext_instance *)0x0;
          }
          else {
            local_260 = orig_type->exts[-1].exts;
          }
          if (local_260 <= __new_start) break;
          type->exts[-1].exts = (lysp_ext_instance *)((long)&(type->exts[-1].exts)->name + 1);
          LVar2 = lysp_ext_dup(ctx,pmod,type,LY_STMT_TYPE,orig_type->exts + __new_start,
                               type->exts + (long)&local_220->name + __new_start);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          __new_start = __new_start + 1;
        }
      }
      type->pmod = orig_type->pmod;
      type->compiled = orig_type->compiled;
      type->fraction_digits = orig_type->fraction_digits;
      type->require_instance = orig_type->require_instance;
      type->flags = orig_type->flags;
    }
  }
  return ret___1;
}

Assistant:

static LY_ERR
lysp_type_dup(const struct ly_ctx *ctx, const struct lysp_module *pmod, const struct lysp_type *orig_type,
        struct lysp_type *type)
{
    LY_ERR ret = LY_SUCCESS;

    /* array macros read previous data so we must zero it */
    memset(type, 0, sizeof *type);

    DUP_STRING_GOTO(ctx, orig_type->name, type->name, ret, done);

    if (orig_type->range) {
        type->range = calloc(1, sizeof *type->range);
        LY_CHECK_ERR_RET(!type->range, LOGMEM(ctx), LY_EMEM);
        LY_CHECK_RET(lysp_restr_dup(ctx, pmod, orig_type->range, type->range));
    }

    if (orig_type->length) {
        type->length = calloc(1, sizeof *type->length);
        LY_CHECK_ERR_RET(!type->length, LOGMEM(ctx), LY_EMEM);
        LY_CHECK_RET(lysp_restr_dup(ctx, pmod, orig_type->length, type->length));
    }

    DUP_ARRAY2(ctx, pmod, orig_type->patterns, type->patterns, lysp_restr_dup);
    DUP_ARRAY2(ctx, pmod, orig_type->enums, type->enums, lysp_type_enum_dup);
    DUP_ARRAY2(ctx, pmod, orig_type->bits, type->bits, lysp_type_enum_dup);
    LY_CHECK_GOTO(ret = lyxp_expr_dup(ctx, orig_type->path, 0, 0, &type->path), done);
    DUP_ARRAY(ctx, orig_type->bases, type->bases, lysp_string_dup);
    DUP_ARRAY2(ctx, pmod, orig_type->types, type->types, lysp_type_dup);
    DUP_EXTS(ctx, pmod, type, LY_STMT_TYPE, orig_type->exts, type->exts, lysp_ext_dup);

    type->pmod = orig_type->pmod;
    type->compiled = orig_type->compiled;

    type->fraction_digits = orig_type->fraction_digits;
    type->require_instance = orig_type->require_instance;
    type->flags = orig_type->flags;

done:
    return ret;
}